

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
                 (char *target,ArrayPtr<const_char> *first,ArrayPtr<const_char> *rest,
                 CappedArray<char,_26UL> *rest_1,ArrayPtr<const_char> *rest_2)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = first->ptr;
  sVar1 = first->size_;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    target[sVar2] = pcVar3[sVar2];
  }
  pcVar3 = fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
                     (target + sVar2,rest,rest_1,rest_2);
  return pcVar3;
}

Assistant:

inline constexpr const T* begin() const { return ptr; }